

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O1

void __thiscall
kj::(anonymous_namespace)::expectResImpl<kj::Array<char32_t>,char32_t>
          (_anonymous_namespace_ *this,EncodingResult<kj::Array<char32_t>_> *result,
          ArrayPtr<const_char32_t> expected,bool errors)

{
  _anonymous_namespace_ *p_Var1;
  long lVar2;
  bool *pbVar3;
  long lVar4;
  bool *pbVar5;
  DebugExpression<const_bool_&> _kjCondition;
  unsigned_long i;
  CappedArray<char,_9UL> local_60;
  CappedArray<char,_9UL> local_48;
  
  pbVar3 = (bool *)expected.ptr;
  p_Var1 = this + 0x18;
  if ((int)expected.size_ == 0) {
    _kjCondition.value = (bool *)(CONCAT71(_kjCondition.value._1_7_,*p_Var1) ^ 1);
    if ((*p_Var1 != (_anonymous_namespace_)0x0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[35],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x31,ERROR,"\"failed: expected \" \"!result.hadErrors\", _kjCondition",
                 (char (*) [35])"failed: expected !result.hadErrors",
                 (DebugExpression<bool> *)&_kjCondition);
    }
  }
  else if ((*p_Var1 == (_anonymous_namespace_)0x0) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition.value = (bool *)p_Var1;
    kj::_::Debug::log<char_const(&)[34],kj::_::DebugExpression<bool_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x2f,ERROR,"\"failed: expected \" \"result.hadErrors\", _kjCondition",
               (char (*) [34])"failed: expected result.hadErrors",&_kjCondition);
  }
  _kjCondition.value = *(bool **)(this + 8);
  if ((_kjCondition.value != pbVar3) && (kj::_::Debug::minSeverity < 3)) {
    local_60.currentSize = (size_t)_kjCondition.value;
    local_48.currentSize = (size_t)pbVar3;
    kj::_::Debug::
    log<char_const(&)[50],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x34,ERROR,
               "\"failed: expected \" \"result.size() == expected.size()\", _kjCondition, result.size(), expected.size()"
               ,(char (*) [50])"failed: expected result.size() == expected.size()",
               (DebugComparison<unsigned_long,_unsigned_long> *)&_kjCondition,&local_60.currentSize,
               &local_48.currentSize);
  }
  if (*(bool **)(this + 8) < pbVar3) {
    pbVar3 = *(bool **)(this + 8);
  }
  if (pbVar3 != (bool *)0x0) {
    lVar4 = 0;
    pbVar5 = (bool *)0x0;
    do {
      lVar2 = *(long *)this;
      _kjCondition.value = (bool *)(lVar2 + lVar4);
      if ((*(int *)(lVar2 + (long)pbVar5 * 4) !=
           *(int *)((long)&(result->super_Array<char32_t>).ptr + lVar4)) &&
         (kj::_::Debug::minSeverity < 3)) {
        i = (unsigned_long)pbVar5;
        hex(&local_60,*(uint *)(lVar2 + (long)pbVar5 * 4));
        hex(&local_48,*(uint *)((long)&(result->super_Array<char32_t>).ptr + i * 4));
        kj::_::Debug::
        log<char_const(&)[42],kj::_::DebugComparison<char32_t&,char32_t_const&>&,unsigned_long&,kj::CappedArray<char,9ul>,kj::CappedArray<char,9ul>>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
                   ,0x36,ERROR,
                   "\"failed: expected \" \"result[i] == expected[i]\", _kjCondition, i, hex(result[i]), hex(expected[i])"
                   ,(char (*) [42])"failed: expected result[i] == expected[i]",
                   (DebugComparison<char32_t_&,_const_char32_t_&> *)&_kjCondition,&i,&local_60,
                   &local_48);
      }
      pbVar5 = pbVar5 + 1;
      lVar4 = lVar4 + 4;
    } while (pbVar3 != pbVar5);
  }
  return;
}

Assistant:

void expectResImpl(EncodingResult<T> result,
                   ArrayPtr<const U> expected,
                   bool errors = false) {
  if (errors) {
    KJ_EXPECT(result.hadErrors);
  } else {
    KJ_EXPECT(!result.hadErrors);
  }

  KJ_EXPECT(result.size() == expected.size(), result.size(), expected.size());
  for (auto i: kj::zeroTo(kj::min(result.size(), expected.size()))) {
    KJ_EXPECT(result[i] == expected[i], i, hex(result[i]), hex(expected[i]));
  }
}